

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord1.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EllipsoidRecord1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EllipsoidRecord1 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tCentroid Location: ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_CentLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tSigma:             ");
  Vector::GetAsString_abi_cxx11_(&local_200,&this->m_Sigma);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\tOrientation:       ");
  EulerAngles::GetAsString_abi_cxx11_(&local_220,&this->m_Ori);
  std::operator<<(poVar1,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EllipsoidRecord1::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tCentroid Location: " << m_CentLocation.GetAsString()
       << "\tSigma:             " << m_Sigma.GetAsString()
       << "\tOrientation:       " << m_Ori.GetAsString();

    return ss.str();
}